

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateExpandDimsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  int iVar3;
  pointer pcVar4;
  _Base_ptr p_Var5;
  long lVar6;
  bool bVar7;
  long *plVar8;
  undefined1 *puVar9;
  LogMessage *pLVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  undefined8 *puVar12;
  int **ppiVar13;
  _Base_ptr p_Var14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  Result *_result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  _Alloc_hider _Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  _Rb_tree_header *p_Var22;
  iterator iVar23;
  int iVar24;
  string err_2;
  int a;
  vector<int,_std::allocator<int>_> axes;
  string err;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  string local_160;
  uint local_140;
  int local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  iterator iStack_f0;
  int *local_e8;
  int local_dc;
  undefined1 local_d8 [56];
  undefined1 local_a0 [16];
  int *local_90;
  _Alloc_hider _Stack_88;
  int *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar16 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar16) {
    operator_delete(pcVar4,paVar16->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar16) {
    operator_delete(pcVar4,paVar16->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x465) {
    puVar9 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar9 = Specification::_ExpandDimsLayerParams_default_instance_;
  }
  if ((((ConvolutionLayerParams *)puVar9)->kernelsize_).current_size_ == 0) {
    plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    pp_Var2 = &local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    lVar6 = *plVar8;
    local_60._M_impl._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,lVar6,plVar8[1] + lVar6);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x3e415d);
    ppiVar13 = (int **)(plVar8 + 2);
    if ((int **)*plVar8 == ppiVar13) {
      local_90 = *ppiVar13;
      _Stack_88._M_p = (pointer)plVar8[3];
      local_a0._0_8_ = &local_90;
    }
    else {
      local_90 = *ppiVar13;
      local_a0._0_8_ = (int **)*plVar8;
    }
    local_a0._8_8_ = plVar8[1];
    *plVar8 = (long)ppiVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_a0);
    psVar15 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar15) {
      local_d8._16_8_ = *psVar15;
      local_d8._24_8_ = plVar8[3];
      local_d8._0_8_ = local_d8 + 0x10;
    }
    else {
      local_d8._16_8_ = *psVar15;
      local_d8._0_8_ = (size_type *)*plVar8;
    }
    local_d8._8_8_ = plVar8[1];
    *plVar8 = (long)psVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((int **)local_a0._0_8_ != &local_90) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 + 1);
    }
    if ((_Base_ptr *)local_60._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)local_60._M_impl._0_8_,
                      (ulong)((long)&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    return __return_storage_ptr__;
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (layer->_oneof_case_[0] == 0x465) {
    puVar9 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar9 = Specification::_ExpandDimsLayerParams_default_instance_;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < (((ConvolutionLayerParams *)puVar9)->kernelsize_).current_size_) {
    iVar24 = 0;
    do {
      plVar8 = google::protobuf::RepeatedField<long>::Get
                         (&((ReshapeLayerParams *)puVar9)->targetshape_,iVar24);
      iVar3 = (int)*plVar8;
      local_138._M_dataplus._M_p._0_4_ = iVar3;
      p_Var14 = &p_Var1->_M_header;
      for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < iVar3]) {
        if (iVar3 <= (int)*(size_t *)(p_Var5 + 1)) {
          p_Var14 = p_Var5;
        }
      }
      p_Var22 = p_Var1;
      if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
         (p_Var22 = (_Rb_tree_header *)p_Var14,
         iVar3 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
        p_Var22 = p_Var1;
      }
      if (p_Var22 == p_Var1) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,(int *)&local_138);
      }
      else {
        plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        lVar6 = *plVar8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_160,lVar6,plVar8[1] + lVar6);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,0x3e415d);
        local_a0._0_8_ = &local_90;
        ppiVar13 = (int **)(plVar8 + 2);
        if ((int **)*plVar8 == ppiVar13) {
          local_90 = *ppiVar13;
          _Stack_88._M_p = (pointer)plVar8[3];
        }
        else {
          local_90 = *ppiVar13;
          local_a0._0_8_ = (int **)*plVar8;
        }
        local_a0._8_8_ = plVar8[1];
        *plVar8 = (long)ppiVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append(local_a0);
        local_d8._0_8_ = local_d8 + 0x10;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar15) {
          local_d8._16_8_ = *psVar15;
          local_d8._24_8_ = plVar8[3];
        }
        else {
          local_d8._16_8_ = *psVar15;
          local_d8._0_8_ = (size_type *)*plVar8;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((int **)local_a0._0_8_ != &local_90) {
          operator_delete((void *)local_a0._0_8_,(long)local_90 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
      }
      if (p_Var22 != p_Var1) goto LAB_0036ed68;
      puVar9 = Specification::_ExpandDimsLayerParams_default_instance_;
      if (layer->_oneof_case_[0] == 0x465) {
        puVar9 = *(undefined1 **)&layer->layer_;
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 < (((ConvolutionLayerParams *)puVar9)->kernelsize_).current_size_);
  }
  if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) {
LAB_0036eb7f:
    Result::Result(__return_storage_ptr__);
  }
  else {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar10 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_d8,pLVar10);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
    }
    iVar24 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                     0x24);
    if ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar10 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar10);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
    }
    local_140 = *(uint *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x24);
    if (layer->_oneof_case_[0] == 0x465) {
      puVar9 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar9 = Specification::_ExpandDimsLayerParams_default_instance_;
    }
    iVar3 = (((ConvolutionLayerParams *)puVar9)->kernelsize_).current_size_;
    if (iVar24 + iVar3 == local_140) {
      local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      iStack_f0._M_current = (int *)0x0;
      local_e8 = (int *)0x0;
      if (0 < iVar3) {
        iVar24 = 0;
        local_dc = iVar3;
        do {
          puVar9 = Specification::_ExpandDimsLayerParams_default_instance_;
          if (layer->_oneof_case_[0] == 0x465) {
            puVar9 = *(undefined1 **)&layer->layer_;
          }
          plVar8 = google::protobuf::RepeatedField<long>::Get
                             (&((ReshapeLayerParams *)puVar9)->targetshape_,iVar24);
          local_13c = ((int)*plVar8 >> 0x1f & local_140) + (int)*plVar8;
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (local_f8,iStack_f0._M_current,&local_13c);
          iVar23._M_current = iStack_f0._M_current;
          if (_Var11._M_current == iStack_f0._M_current) {
            if (iStack_f0._M_current == local_e8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_f8,iStack_f0,&local_13c);
            }
            else {
              *iStack_f0._M_current = local_13c;
              iStack_f0._M_current = iStack_f0._M_current + 1;
            }
          }
          else {
            local_68 = iStack_f0._M_current;
            plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            lVar6 = *plVar8;
            std::__cxx11::string::_M_construct<char*>((string *)&local_118,lVar6,plVar8[1] + lVar6);
            plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x3e415d)
            ;
            psVar15 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_138.field_2._M_allocated_capacity = *psVar15;
              local_138.field_2._8_8_ = plVar8[3];
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar15;
              local_138._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_138._M_string_length = plVar8[1];
            *plVar8 = (long)psVar15;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            psVar15 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_160.field_2._M_allocated_capacity = *psVar15;
              local_160.field_2._8_8_ = puVar12[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar15;
              local_160._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_160._M_string_length = puVar12[1];
            *puVar12 = psVar15;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_160);
            iVar23._M_current = local_68;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
              iVar23._M_current = local_68;
            }
          }
          if (_Var11._M_current != iVar23._M_current) goto LAB_0036ed4e;
          iVar24 = iVar24 + 1;
        } while (local_dc != iVar24);
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_f8->_M_local_buf + 4);
      paVar17 = paVar16;
      paVar20 = local_f8;
      paVar21 = local_f8;
      if (paVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_f0._M_current &&
          local_f8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_f0._M_current) {
        do {
          paVar20 = paVar17;
          if (*(int *)paVar17 <= *(int *)paVar21) {
            paVar20 = paVar21;
          }
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar17 + 4);
          paVar21 = paVar20;
        } while (paVar17 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)iStack_f0._M_current);
      }
      paVar17 = local_f8;
      paVar21 = local_f8;
      if (paVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_f0._M_current &&
          local_f8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_f0._M_current) {
        do {
          paVar21 = paVar16;
          if (*(int *)paVar17 <= *(int *)paVar16) {
            paVar21 = paVar17;
          }
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar16 + 4);
          paVar17 = paVar21;
        } while (paVar16 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)iStack_f0._M_current);
      }
      if ((*(int *)paVar20 < (int)local_140) && (-1 < *(int *)paVar21)) {
        if (local_f8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_f8,(long)local_e8 - (long)local_f8);
        }
        goto LAB_0036eb7f;
      }
      plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar6 = *plVar8;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_118,lVar6,plVar8[1] + lVar6);
      std::operator+(&local_138,"ExpandDims Layer \'",&local_118);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_160.field_2._M_allocated_capacity = *psVar15;
        local_160.field_2._8_8_ = puVar12[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar15;
        local_160._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_160._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
LAB_0036ed4e:
      if (local_f8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_0036ed68;
      uVar18 = (long)local_e8 - (long)local_f8;
      _Var19._M_p = (pointer)local_f8;
    }
    else {
      plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar6 = *plVar8;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_118,lVar6,plVar8[1] + lVar6);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x3e415d);
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_138.field_2._M_allocated_capacity = *psVar15;
        local_138.field_2._8_8_ = plVar8[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar15;
        local_138._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_138._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_160.field_2._M_allocated_capacity = *psVar15;
        local_160.field_2._8_8_ = puVar12[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar15;
        local_160._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_160._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p == &local_160.field_2) goto LAB_0036ed68;
      uVar18 = local_160.field_2._M_allocated_capacity + 1;
      _Var19._M_p = local_160._M_dataplus._M_p;
    }
    operator_delete(_Var19._M_p,uVar18);
  }
LAB_0036ed68:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateExpandDimsLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.expanddims().axes_size() == 0) {
        std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // either all values in axes must be positive or all negative
    std::set<int> axes_set;
    for (int i=0; i<layer.expanddims().axes_size(); i++) {
        int a = (int)layer.expanddims().axes(i);
        if (axes_set.find(a) != axes_set.end()) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else {
            axes_set.insert(a);
        }
    }

    if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
        int input_rank = static_cast<int>(layer.inputtensor(0).rank());
        int output_rank = static_cast<int>(layer.outputtensor(0).rank());
        int axes_length = layer.expanddims().axes_size();

        if (input_rank + axes_length != output_rank) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': input rank plus the length of the axes parameter must equal output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        std::vector<int> axes;
        for (int i=0; i<axes_length; i++) {
            int a = (int)layer.expanddims().axes(i);
            if (a < 0) {
                a = output_rank + a;
            }
            if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
            axes.push_back(a);
        }

        int max_value = *std::max_element(axes.begin(), axes.end());
        int min_value = *std::min_element(axes.begin(), axes.end());
        if (max_value > output_rank - 1 || min_value < 0) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}